

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::FileOptions::_InternalParse(FileOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  void *pvVar5;
  Rep *pRVar6;
  UninterpretedOption *msg;
  ulong uVar7;
  char cVar8;
  uint32 uVar9;
  uint tag;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Arena *arena;
  string *s;
  UnknownFieldSet *this_01;
  byte *pbVar13;
  ArenaStringPtr *this_02;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  pair<const_char_*,_bool> pVar16;
  
  this_00 = &this->_internal_metadata_;
  uVar10 = 0;
LAB_0016da4d:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_0016e351;
      pVar16 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar16.first;
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0016e351;
    }
    bVar2 = *ptr;
    pVar14.second._0_1_ = bVar2;
    pVar14.first = (char *)((byte *)ptr + 1);
    pVar14._9_7_ = 0;
    if ((char)bVar2 < '\0') {
      bVar3 = ((byte *)ptr)[1];
      uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
      if ((char)bVar3 < '\0') {
        pVar14 = internal::ReadTagFallback(ptr,uVar9);
        if (pVar14.first == (char *)0x0) goto LAB_0016e34e;
      }
      else {
        pVar14.second = uVar9;
        pVar14.first = (char *)((byte *)ptr + 2);
        pVar14._12_4_ = 0;
      }
    }
    pbVar13 = (byte *)pVar14.first;
    tag = pVar14.second;
    uVar12 = (uint)(pVar14._8_8_ >> 3) & 0x1fffffff;
    cVar8 = (char)pVar14.second;
    switch(uVar12) {
    case 1:
      if (cVar8 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      s = (this->java_package_).ptr_;
      this_02 = &this->java_package_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_0016e064:
        internal::ArenaStringPtr::CreateInstance
                  (this_02,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_02->ptr_;
      }
LAB_0016e07d:
      ptr = internal::InlineGreedyStringParser(s,(char *)pbVar13,ctx);
      goto LAB_0016e08b;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x26:
    case 0x2b:
      break;
    case 8:
      if (cVar8 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->java_outer_classname_).ptr_;
        this_02 = &this->java_outer_classname_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 9:
      if (cVar8 == 'H') {
        bVar2 = *pbVar13;
        pVar15.second = (long)(char)bVar2;
        pVar15.first = (char *)(pbVar13 + 1);
        if ((long)(char)bVar2 < 0) {
          bVar3 = pbVar13[1];
          uVar9 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
          if ((char)bVar3 < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar9);
            if (pVar15.first == (char *)0x0) {
              ptr = (char *)0x0;
              goto LAB_0016e351;
            }
          }
          else {
            pVar15.second._0_4_ = uVar9;
            pVar15.first = (char *)(pbVar13 + 2);
            pVar15.second._4_4_ = 0;
          }
        }
        ptr = pVar15.first;
        if ((int)pVar15.second - 1U < 3) {
          pbVar13 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
          *pbVar13 = *pbVar13 | 8;
          this->optimize_for_ = (int)pVar15.second;
        }
        else {
          pvVar5 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar5 & 1) == 0) {
            this_01 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            this_01 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          UnknownFieldSet::AddVarint(this_01,9,pVar15.second);
        }
        goto LAB_0016da4d;
      }
      break;
    case 10:
      if (cVar8 == 'P') {
        uVar10 = uVar10 | 0x400;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->java_multiple_files_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->java_multiple_files_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0xb:
      if (cVar8 == 'Z') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->go_package_).ptr_;
        this_02 = &this->go_package_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x10:
      break;
    case 0x11:
      if (cVar8 == -0x78) {
        uVar10 = uVar10 | 0x4000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->java_generic_services_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->java_generic_services_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x12:
      if (cVar8 == -0x70) {
        uVar10 = uVar10 | 0x8000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->py_generic_services_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->py_generic_services_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x14:
      if (cVar8 == -0x60) {
        uVar10 = uVar10 | 0x800;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->java_generate_equals_and_hash_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->java_generate_equals_and_hash_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x17:
      if (cVar8 == -0x48) {
        uVar10 = uVar10 | 0x20000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->deprecated_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->deprecated_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x1b:
      if (cVar8 == -0x28) {
        uVar10 = uVar10 | 0x1000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->java_string_check_utf8_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->java_string_check_utf8_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x1f:
      if (cVar8 == -8) {
        uVar10 = uVar10 | 0x40000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->cc_enable_arenas_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->cc_enable_arenas_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x24:
      if (cVar8 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->objc_class_prefix_).ptr_;
        this_02 = &this->objc_class_prefix_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x25:
      if (cVar8 == '*') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->csharp_namespace_).ptr_;
        this_02 = &this->csharp_namespace_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x27:
      if (cVar8 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->swift_prefix_).ptr_;
        this_02 = &this->swift_prefix_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x28:
      if (cVar8 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->php_class_prefix_).ptr_;
        this_02 = &this->php_class_prefix_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x29:
      if (cVar8 == 'J') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->php_namespace_).ptr_;
        this_02 = &this->php_namespace_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x2a:
      if (cVar8 == 'P') {
        uVar10 = uVar10 | 0x10000;
        uVar7 = (ulong)(char)*pbVar13;
        ptr = (char *)(pbVar13 + 1);
        if ((long)uVar7 < 0) {
          uVar12 = ((uint)*pbVar13 + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar15 = internal::VarintParseSlow64((char *)pbVar13,uVar12);
            ptr = pVar15.first;
            this->php_generic_services_ = pVar15.second != 0;
            goto LAB_0016e08b;
          }
          uVar7 = (ulong)uVar12;
          ptr = (char *)(pbVar13 + 2);
        }
        this->php_generic_services_ = uVar7 != 0;
        goto LAB_0016da4d;
      }
      break;
    case 0x2c:
      if (cVar8 == 'b') {
        pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->php_metadata_namespace_).ptr_;
        this_02 = &this->php_metadata_namespace_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    case 0x2d:
      if (cVar8 == 'j') {
        pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 2;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        s = (this->ruby_package_).ptr_;
        this_02 = &this->ruby_package_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016e064;
        goto LAB_0016e07d;
      }
      break;
    default:
      if ((uVar12 == 999) && (cVar8 == ':')) {
        ptr = (char *)(pbVar13 + -2);
        do {
          pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar11 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016db0d:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar11 + 1);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar11 = pRVar6->allocated_size;
LAB_0016db1f:
            pRVar6->allocated_size = iVar11 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar11 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
            pRVar6->elements[iVar11] = msg;
          }
          else {
            iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar11 = pRVar6->allocated_size;
            if (iVar11 <= iVar4) {
              if (iVar11 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016db0d;
              goto LAB_0016db1f;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
            msg = (UninterpretedOption *)pRVar6->elements[iVar4];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) goto LAB_0016e34e;
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_0016da4d;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      ptr = (char *)pbVar13;
      goto LAB_0016e351;
    }
    if (tag < 8000) {
      ptr = internal::UnknownFieldParse(tag,this_00,(char *)pbVar13,ctx);
    }
    else {
      ptr = internal::ExtensionSet::ParseField
                      (&this->_extensions_,pVar14._8_8_ & 0xffffffff,(char *)pbVar13,
                       (Message *)_FileOptions_default_instance_,this_00,ctx);
    }
LAB_0016e08b:
    if ((byte *)ptr == (byte *)0x0) {
LAB_0016e34e:
      ptr = (char *)(byte *)0x0;
LAB_0016e351:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar10;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* FileOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string java_package = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_package(), ptr, ctx, "google.protobuf.FileOptions.java_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string java_outer_classname = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_java_outer_classname(), ptr, ctx, "google.protobuf.FileOptions.java_outer_classname");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode_IsValid(val))) {
            _internal_set_optimize_for(static_cast<PROTOBUF_NAMESPACE_ID::FileOptions_OptimizeMode>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(9, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool java_multiple_files = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_java_multiple_files(&has_bits);
          java_multiple_files_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string go_package = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_go_package(), ptr, ctx, "google.protobuf.FileOptions.go_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_generic_services = 16 [default = false];
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 128)) {
          _Internal::set_has_cc_generic_services(&has_bits);
          cc_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generic_services = 17 [default = false];
      case 17:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 136)) {
          _Internal::set_has_java_generic_services(&has_bits);
          java_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool py_generic_services = 18 [default = false];
      case 18:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 144)) {
          _Internal::set_has_py_generic_services(&has_bits);
          py_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 160)) {
          _Internal::set_has_java_generate_equals_and_hash(&has_bits);
          java_generate_equals_and_hash_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 23 [default = false];
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 184)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 216)) {
          _Internal::set_has_java_string_check_utf8(&has_bits);
          java_string_check_utf8_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool cc_enable_arenas = 31 [default = false];
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 248)) {
          _Internal::set_has_cc_enable_arenas(&has_bits);
          cc_enable_arenas_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string objc_class_prefix = 36;
      case 36:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_objc_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.objc_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string csharp_namespace = 37;
      case 37:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_csharp_namespace(), ptr, ctx, "google.protobuf.FileOptions.csharp_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string swift_prefix = 39;
      case 39:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_swift_prefix(), ptr, ctx, "google.protobuf.FileOptions.swift_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_class_prefix = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_class_prefix(), ptr, ctx, "google.protobuf.FileOptions.php_class_prefix");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_namespace = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool php_generic_services = 42 [default = false];
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_php_generic_services(&has_bits);
          php_generic_services_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string php_metadata_namespace = 44;
      case 44:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_php_metadata_namespace(), ptr, ctx, "google.protobuf.FileOptions.php_metadata_namespace");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string ruby_package = 45;
      case 45:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_ruby_package(), ptr, ctx, "google.protobuf.FileOptions.ruby_package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}